

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<long,(unsigned_char)2>,wabt::interp::Simd<int,(unsigned_char)2>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Simd<long,_(unsigned_char)__x02_> value;
  Instr instr_00;
  RunResult RVar1;
  byte local_51;
  long lStack_50;
  u8 i;
  Simd<long,_(unsigned_char)__x02_> result;
  Simd<int,_(unsigned_char)__x02_> local_28;
  Simd<int,_(unsigned_char)__x02_> val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  instr_00 = instr;
  result.v[1]._0_4_ = instr.op.enum_;
  result.v[1]._4_4_ = instr.kind;
  val.v = (int  [2])out_trap;
  RVar1 = Load<wabt::interp::Simd<int,(unsigned_char)2>>(this,instr_00,&local_28,out_trap);
  if (RVar1 == Ok) {
    for (local_51 = 0; local_51 < 2; local_51 = local_51 + 1) {
      *(long *)((long)&stack0xffffffffffffffb0 + (ulong)local_51 * 8) = (long)(&val)[-1].v[local_51]
      ;
    }
    value.v[1] = result.v[0];
    value.v[0] = lStack_50;
    Push<wabt::interp::Simd<long,(unsigned_char)2>>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[i];
  }
  Push(result);
  return RunResult::Ok;
}